

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O3

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,cmake *cm,bool isNew,int labelwidth,
          int entrywidth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmState *this_00;
  bool value;
  CacheEntryType CVar3;
  cmCursesLabelWidget *pcVar4;
  char *__s;
  cmCursesWidget *this_01;
  cmCursesPathWidget *this_02;
  char *__s_00;
  cmCursesOptionsWidget *this_03;
  size_t sVar5;
  cmCursesStringWidget *pcVar6;
  string *option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string *local_38;
  
  local_38 = &this->Key;
  local_60 = &(this->Key).field_2;
  (this->Key)._M_dataplus._M_p = (pointer)local_60;
  pcVar2 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + key->_M_string_length);
  this->LabelWidth = labelwidth;
  this->EntryWidth = entrywidth;
  pcVar4 = (cmCursesLabelWidget *)operator_new(0x40);
  cmCursesLabelWidget::cmCursesLabelWidget(pcVar4,labelwidth,1,1,1,key);
  this->Label = pcVar4;
  if (isNew) {
    pcVar4 = (cmCursesLabelWidget *)operator_new(0x40);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"*","");
    cmCursesLabelWidget::cmCursesLabelWidget(pcVar4,1,1,1,1,&local_80);
  }
  else {
    pcVar4 = (cmCursesLabelWidget *)operator_new(0x40);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80," ","");
    cmCursesLabelWidget::cmCursesLabelWidget(pcVar4,1,1,1,1,&local_80);
  }
  this->IsNewLabel = pcVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  this->Entry = (cmCursesWidget *)0x0;
  __s = cmState::GetCacheEntryValue(cm->State,key);
  if (__s == (char *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CursesDialog/cmCursesCacheEntryComposite.cxx"
                  ,0x37,
                  "cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(const std::string &, cmake *, bool, int, int)"
                 );
  }
  CVar3 = cmState::GetCacheEntryType(cm->State,key);
  switch(CVar3) {
  case BOOL:
    this_01 = (cmCursesWidget *)operator_new(0x40);
    cmCursesBoolWidget::cmCursesBoolWidget((cmCursesBoolWidget *)this_01,this->EntryWidth,1,1,1);
    this->Entry = this_01;
    value = cmSystemTools::IsOn(__s);
    cmCursesBoolWidget::SetValueAsBool((cmCursesBoolWidget *)this->Entry,value);
    break;
  case PATH:
    this_02 = (cmCursesPathWidget *)operator_new(0xa0);
    cmCursesPathWidget::cmCursesPathWidget(this_02,this->EntryWidth,1,1,1);
    this->Entry = (cmCursesWidget *)this_02;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar5);
    cmCursesStringWidget::SetString((cmCursesStringWidget *)this_02,&local_80);
    goto LAB_002251fe;
  case FILEPATH:
    pcVar6 = (cmCursesStringWidget *)operator_new(0xa0);
    cmCursesFilePathWidget::cmCursesFilePathWidget
              ((cmCursesFilePathWidget *)pcVar6,this->EntryWidth,1,1,1);
    this->Entry = (cmCursesWidget *)pcVar6;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar5);
    cmCursesStringWidget::SetString(pcVar6,&local_80);
LAB_002251fe:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
LAB_0022520c:
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    break;
  case STRING:
    this_00 = cm->State;
    paVar1 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"STRINGS","");
    __s_00 = cmState::GetCacheEntryProperty(this_00,key,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (__s_00 != (char *)0x0) {
      this_03 = (cmCursesOptionsWidget *)operator_new(0x60);
      cmCursesOptionsWidget::cmCursesOptionsWidget(this_03,this->EntryWidth,1,1,1);
      this->Entry = (cmCursesWidget *)this_03;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      sVar5 = strlen(__s_00);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s_00,__s_00 + sVar5);
      cmSystemTools::ExpandListArgument(&local_80,&local_58,false);
      option = local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        option = local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      for (; option != local_58.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; option = option + 1) {
        cmCursesOptionsWidget::AddOption(this_03,option);
      }
      local_80._M_dataplus._M_p = (pointer)paVar1;
      sVar5 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar5);
      cmCursesOptionsWidget::SetOption(this_03,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      return;
    }
    pcVar6 = (cmCursesStringWidget *)operator_new(0x50);
    cmCursesStringWidget::cmCursesStringWidget(pcVar6,this->EntryWidth,1,1,1);
    this->Entry = (cmCursesWidget *)pcVar6;
    local_80._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar5);
    cmCursesStringWidget::SetString(pcVar6,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar1) {
      return;
    }
    goto LAB_0022520c;
  case UNINITIALIZED:
    cmSystemTools::Error
              ("Found an undefined variable: ",(key->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
  }
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
  const std::string& key, cmake *cm, bool isNew,
  int labelwidth, int entrywidth)
  : Key(key), LabelWidth(labelwidth), EntryWidth(entrywidth)
{
  this->Label = new cmCursesLabelWidget(this->LabelWidth, 1, 1, 1, key);
  if (isNew)
    {
    this->IsNewLabel = new cmCursesLabelWidget(1, 1, 1, 1, "*");
    }
  else
    {
    this->IsNewLabel = new cmCursesLabelWidget(1, 1, 1, 1, " ");
    }

  this->Entry = 0;
  const char* value = cm->GetState()->GetCacheEntryValue(key);
  assert(value);
  switch (cm->GetState()->GetCacheEntryType(key))
    {
    case cmState::BOOL:
      this->Entry = new cmCursesBoolWidget(this->EntryWidth, 1, 1, 1);
      if (cmSystemTools::IsOn(value))
        {
        static_cast<cmCursesBoolWidget*>(this->Entry)->SetValueAsBool(true);
        }
      else
        {
        static_cast<cmCursesBoolWidget*>(this->Entry)->SetValueAsBool(false);
        }
      break;
    case cmState::PATH:
      this->Entry = new cmCursesPathWidget(this->EntryWidth, 1, 1, 1);
      static_cast<cmCursesPathWidget*>(this->Entry)->SetString(value);
      break;
    case cmState::FILEPATH:
      this->Entry = new cmCursesFilePathWidget(this->EntryWidth, 1, 1, 1);
      static_cast<cmCursesFilePathWidget*>(this->Entry)->SetString(value);
      break;
    case cmState::STRING:
      {
      const char* stringsProp = cm->GetState()
                                  ->GetCacheEntryProperty(key, "STRINGS");
      if(stringsProp)
        {
        cmCursesOptionsWidget* ow =
          new cmCursesOptionsWidget(this->EntryWidth, 1, 1, 1);
        this->Entry = ow;
        std::vector<std::string> options;
        cmSystemTools::ExpandListArgument(stringsProp, options);
        for(std::vector<std::string>::iterator
              si = options.begin(); si != options.end(); ++si)
          {
          ow->AddOption(*si);
          }
        ow->SetOption(value);
        }
      else
        {
        this->Entry = new cmCursesStringWidget(this->EntryWidth, 1, 1, 1);
        static_cast<cmCursesStringWidget*>(this->Entry)->SetString(value);
        }
      break;
      }
    case cmState::UNINITIALIZED:
      cmSystemTools::Error("Found an undefined variable: ",
                           key.c_str());
      break;
    default:
      // TODO : put warning message here
      break;
    }

}